

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O1

int aes_ctr_encrypt_counter(archive_crypto_ctx *ctx)

{
  uint in_EAX;
  int iVar1;
  int outl;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)ctx->ctx,(EVP_CIPHER *)ctx->type,(ENGINE *)0x0,
                             ctx->key,(uchar *)0x0);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)ctx->ctx,ctx->encr_buf,(int *)((long)&uStack_18 + 4)
                              ,ctx->nonce,0x10);
    iVar1 = -(uint)(uStack_18._4_4_ != 0x10 || iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int
aes_ctr_encrypt_counter(archive_crypto_ctx *ctx)
{
	int outl = 0;
	int r;

	r = EVP_EncryptInit_ex(ctx->ctx, ctx->type, NULL, ctx->key, NULL);
	if (r == 0)
		return -1;
	r = EVP_EncryptUpdate(ctx->ctx, ctx->encr_buf, &outl, ctx->nonce,
	    AES_BLOCK_SIZE);
	if (r == 0 || outl != AES_BLOCK_SIZE)
		return -1;
	return 0;
}